

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_copy(roaring64_bitmap_t *r)

{
  roaring64_bitmap_t *art;
  container_t *container;
  leaf_t *val;
  uint8_t result_typecode;
  art_iterator_t it;
  
  art = roaring64_bitmap_create();
  art_init_iterator(&it,&r->art,true);
  while (it.value != (art_val_t *)0x0) {
    result_typecode = it.value[1].key[0];
    container = get_copy_of_container(*(container_t **)(it.value[1].key + 2),&result_typecode,false)
    ;
    val = create_leaf(container,result_typecode);
    art_insert(&art->art,it.key,&val->_pad);
    art_iterator_next(&it);
  }
  return art;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_copy(const roaring64_bitmap_t *r) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        uint8_t result_typecode = leaf->typecode;
        container_t *result_container = get_copy_of_container(
            leaf->container, &result_typecode, /*copy_on_write=*/false);
        leaf_t *result_leaf = create_leaf(result_container, result_typecode);
        art_insert(&result->art, it.key, (art_val_t *)result_leaf);
        art_iterator_next(&it);
    }
    return result;
}